

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

PROV_DRBG *
ossl_rand_drbg_new(void *provctx,void *parent,OSSL_DISPATCH *p_dispatch,
                  _func_int_PROV_DRBG_ptr *dnew,
                  _func_int_PROV_DRBG_ptr_uchar_ptr_size_t_uchar_ptr_size_t_uchar_ptr_size_t
                  *instantiate,_func_int_PROV_DRBG_ptr *uninstantiate,
                  _func_int_PROV_DRBG_ptr_uchar_ptr_size_t_uchar_ptr_size_t *reseed,
                  _func_int_PROV_DRBG_ptr_uchar_ptr_size_t_uchar_ptr_size_t *generate)

{
  int iVar1;
  PROV_DRBG *file;
  OSSL_DISPATCH *pOVar2;
  undefined1 *puVar3;
  OSSL_FUNC_rand_unlock_fn *pOVar4;
  OSSL_FUNC_rand_get_ctx_params_fn *pOVar5;
  OSSL_FUNC_rand_nonce_fn *pOVar6;
  OSSL_FUNC_rand_get_seed_fn *pOVar7;
  OSSL_FUNC_rand_clear_seed_fn *pOVar8;
  code *in_RCX;
  OSSL_DISPATCH *in_RDX;
  void *in_RSI;
  PROV_CTX *in_RDI;
  _func_int_PROV_DRBG_ptr_uchar_ptr_size_t_uchar_ptr_size_t_uchar_ptr_size_t *in_R8;
  _func_int_PROV_DRBG_ptr *in_R9;
  OSSL_DISPATCH *pfunc;
  _func_int_PROV_DRBG_ptr_uchar_ptr_size_t_uchar_ptr_size_t *in_stack_00000010;
  uint p_str;
  PROV_DRBG *drbg;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 != 0) {
    file = (PROV_DRBG *)
           CRYPTO_zalloc(in_stack_ffffffffffffffc0,
                         (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (file == (PROV_DRBG *)0x0) {
      ERR_new();
      ERR_set_debug((char *)file,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
      ERR_set_error(0x39,0xc0100,(char *)0x0);
    }
    else {
      file->provctx = in_RDI;
      file->instantiate = in_R8;
      file->uninstantiate = in_R9;
      file->reseed = (_func_int_PROV_DRBG_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)pfunc;
      file->generate = in_stack_00000010;
      iVar1 = openssl_get_fork_id();
      file->fork_id = iVar1;
      file->parent = in_RSI;
      pOVar2 = find_call(in_RDX,8);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        puVar3 = OSSL_FUNC_rand_enable_locking(pOVar2);
        file->parent_enable_locking = puVar3;
      }
      pOVar2 = find_call(in_RDX,9);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        puVar3 = OSSL_FUNC_rand_lock(pOVar2);
        file->parent_lock = puVar3;
      }
      pOVar2 = find_call(in_RDX,10);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        pOVar4 = OSSL_FUNC_rand_unlock(pOVar2);
        file->parent_unlock = pOVar4;
      }
      pOVar2 = find_call(in_RDX,0xf);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        pOVar5 = OSSL_FUNC_rand_get_ctx_params(pOVar2);
        file->parent_get_ctx_params = pOVar5;
      }
      pOVar2 = find_call(in_RDX,7);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        pOVar6 = OSSL_FUNC_rand_nonce(pOVar2);
        file->parent_nonce = pOVar6;
      }
      pOVar2 = find_call(in_RDX,0x12);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        pOVar7 = OSSL_FUNC_rand_get_seed(pOVar2);
        file->parent_get_seed = pOVar7;
      }
      pOVar2 = find_call(in_RDX,0x13);
      if (pOVar2 != (OSSL_DISPATCH *)0x0) {
        pOVar8 = OSSL_FUNC_rand_clear_seed(pOVar2);
        file->parent_clear_seed = pOVar8;
      }
      file->max_entropylen = 0x7fffffff;
      file->max_noncelen = 0x7fffffff;
      file->max_perslen = 0x7fffffff;
      file->max_adinlen = 0x7fffffff;
      file->generate_counter = 1;
      LOCK();
      file->reseed_counter = 1;
      UNLOCK();
      file->reseed_interval = 0x100;
      file->reseed_time_interval = 0xe10;
      iVar1 = (*in_RCX)(file);
      if (iVar1 != 0) {
        if (in_RSI == (void *)0x0) {
          return file;
        }
        iVar1 = get_parent_strength((PROV_DRBG *)p_dispatch,(uint *)dnew);
        if (iVar1 != 0) {
          if (file->strength <= in_stack_ffffffffffffffbc) {
            return file;
          }
          ERR_new();
          ERR_set_debug((char *)file,in_stack_ffffffffffffffbc,(char *)pOVar2);
          ERR_set_error(0x39,0xc2,(char *)0x0);
        }
      }
      ossl_rand_drbg_free((PROV_DRBG *)0x4b4fe6);
    }
  }
  return (PROV_DRBG *)0x0;
}

Assistant:

PROV_DRBG *ossl_rand_drbg_new
    (void *provctx, void *parent, const OSSL_DISPATCH *p_dispatch,
     int (*dnew)(PROV_DRBG *ctx),
     int (*instantiate)(PROV_DRBG *drbg,
                        const unsigned char *entropy, size_t entropylen,
                        const unsigned char *nonce, size_t noncelen,
                        const unsigned char *pers, size_t perslen),
     int (*uninstantiate)(PROV_DRBG *ctx),
     int (*reseed)(PROV_DRBG *drbg, const unsigned char *ent, size_t ent_len,
                   const unsigned char *adin, size_t adin_len),
     int (*generate)(PROV_DRBG *, unsigned char *out, size_t outlen,
                     const unsigned char *adin, size_t adin_len))
{
    PROV_DRBG *drbg;
    unsigned int p_str;
    const OSSL_DISPATCH *pfunc;

    if (!ossl_prov_is_running())
        return NULL;

    drbg = OPENSSL_zalloc(sizeof(*drbg));
    if (drbg == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    drbg->provctx = provctx;
    drbg->instantiate = instantiate;
    drbg->uninstantiate = uninstantiate;
    drbg->reseed = reseed;
    drbg->generate = generate;
    drbg->fork_id = openssl_get_fork_id();

    /* Extract parent's functions */
    drbg->parent = parent;
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_ENABLE_LOCKING)) != NULL)
        drbg->parent_enable_locking = OSSL_FUNC_rand_enable_locking(pfunc);
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_LOCK)) != NULL)
        drbg->parent_lock = OSSL_FUNC_rand_lock(pfunc);
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_UNLOCK)) != NULL)
        drbg->parent_unlock = OSSL_FUNC_rand_unlock(pfunc);
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_GET_CTX_PARAMS)) != NULL)
        drbg->parent_get_ctx_params = OSSL_FUNC_rand_get_ctx_params(pfunc);
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_NONCE)) != NULL)
        drbg->parent_nonce = OSSL_FUNC_rand_nonce(pfunc);
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_GET_SEED)) != NULL)
        drbg->parent_get_seed = OSSL_FUNC_rand_get_seed(pfunc);
    if ((pfunc = find_call(p_dispatch, OSSL_FUNC_RAND_CLEAR_SEED)) != NULL)
        drbg->parent_clear_seed = OSSL_FUNC_rand_clear_seed(pfunc);

    /* Set some default maximums up */
    drbg->max_entropylen = DRBG_MAX_LENGTH;
    drbg->max_noncelen = DRBG_MAX_LENGTH;
    drbg->max_perslen = DRBG_MAX_LENGTH;
    drbg->max_adinlen = DRBG_MAX_LENGTH;
    drbg->generate_counter = 1;
    drbg->reseed_counter = 1;
    drbg->reseed_interval = RESEED_INTERVAL;
    drbg->reseed_time_interval = TIME_INTERVAL;

    if (!dnew(drbg))
        goto err;

    if (parent != NULL) {
        if (!get_parent_strength(drbg, &p_str))
            goto err;
        if (drbg->strength > p_str) {
            /*
             * We currently don't support the algorithm from NIST SP 800-90C
             * 10.1.2 to use a weaker DRBG as source
             */
            ERR_raise(ERR_LIB_PROV, PROV_R_PARENT_STRENGTH_TOO_WEAK);
            goto err;
        }
    }
    return drbg;

 err:
    ossl_rand_drbg_free(drbg);
    return NULL;
}